

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigOutDec.c
# Opt level: O1

Vec_Ptr_t * Saig_ManFindPrimes(Aig_Man_t *pAig,int nLits,int fVerbose)

{
  uint uVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  Cnf_Dat_t *p;
  sat_solver *s;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  void *__s;
  Vec_Int_t *pVVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  size_t __size;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  Aig_Obj_t *pRoot;
  int Lits [10];
  long local_a0;
  Aig_Obj_t *local_88;
  uint local_7c;
  long local_78;
  long local_70;
  int *local_68;
  Vec_Ptr_t *local_60;
  int local_58;
  int local_54;
  int local_50;
  lit local_4c [7];
  
  if (1 < nLits - 1U) {
    __assert_fail("nLits == 1 || nLits == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigOutDec.c"
                  ,0x38,"Vec_Ptr_t *Saig_ManFindPrimes(Aig_Man_t *, int, int)");
  }
  if (9 < nLits) {
    __assert_fail("nLits < 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigOutDec.c"
                  ,0x39,"Vec_Ptr_t *Saig_ManFindPrimes(Aig_Man_t *, int, int)");
  }
  p = Cnf_DeriveSimple(pAig,pAig->nObjs[3]);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  if (pAig->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar2 = *pAig->vCos->pArray;
  local_88 = (Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe);
  __ptr = Aig_ManDfsNodes(pAig,&local_88,1);
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(800);
  pVVar8->pArray = ppvVar9;
  iVar7 = __ptr->nSize;
  local_68 = (int *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar6 = iVar7;
  }
  local_68[1] = 0;
  *local_68 = iVar6;
  if (iVar6 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar6 << 2);
  }
  *(void **)(local_68 + 2) = __s;
  local_68[1] = iVar7;
  memset(__s,0,(long)iVar7 * 4);
  local_58 = p->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2 + 1;
  local_60 = __ptr;
  if (0 < __ptr->nSize) {
    lVar14 = 0;
    do {
      pAVar3 = (Aig_Obj_t *)__ptr->pArray[lVar14];
      if (pAVar3 != local_88) {
        local_54 = (*(uint *)&pAVar3->field_0x18 >> 3 & 1) + p->pVarNums[pAVar3->Id] * 2;
        iVar6 = sat_solver_solve(s,&local_58,&local_50,0,0,0,0);
        if (iVar6 == -1) {
          pVVar10 = (Vec_Int_t *)malloc(0x10);
          pVVar10->nCap = 0x10;
          pVVar10->nSize = 0;
          piVar11 = (int *)malloc(0x40);
          pVVar10->pArray = piVar11;
          Vec_IntPush(pVVar10,(*(uint *)&pAVar3->field_0x18 >> 3 & 1) + pAVar3->Id * 2);
          uVar1 = pVVar8->nSize;
          uVar15 = pVVar8->nCap;
          if (uVar1 == uVar15) {
            if ((int)uVar15 < 0x10) {
              if (pVVar8->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
              }
              iVar6 = 0x10;
            }
            else {
              iVar6 = uVar15 * 2;
              if (iVar6 <= (int)uVar15) goto LAB_0065cd1f;
              if (pVVar8->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((ulong)uVar15 << 4);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar15 << 4);
              }
            }
            pVVar8->pArray = ppvVar9;
            pVVar8->nCap = iVar6;
          }
LAB_0065cd1f:
          pVVar8->nSize = uVar1 + 1;
          pVVar8->pArray[(int)uVar1] = pVVar10;
          if (fVerbose != 0) {
            printf("Adding prime %d%c\n",(ulong)(uint)pAVar3->Id,
                   (ulong)(((*(uint *)&pAVar3->field_0x18 & 8) >> 2) + 0x2b));
          }
          if (iVar7 <= lVar14) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)((long)__s + lVar14 * 4) = 1;
          __ptr = local_60;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < __ptr->nSize);
  }
  local_7c = pVVar8->nSize;
  if ((1 < nLits) && (0 < __ptr->nSize)) {
    local_a0 = 1;
    lVar14 = 0;
    do {
      pAVar3 = (Aig_Obj_t *)__ptr->pArray[lVar14];
      if ((pAVar3 != local_88) && (lVar12 = local_a0, lVar14 + 1 < (long)__ptr->nSize)) {
        do {
          pAVar4 = (Aig_Obj_t *)__ptr->pArray[lVar12];
          if (pAVar4 != local_88) {
            if (local_68[1] <= lVar14) {
LAB_0065d0c7:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (*(int *)(*(long *)(local_68 + 2) + lVar14 * 4) == 0) {
              if (local_68[1] <= lVar12) goto LAB_0065d0c7;
              if (*(int *)(*(long *)(local_68 + 2) + lVar12 * 4) == 0) {
                uVar16 = 0;
                do {
                  uVar15 = (uint)uVar16;
                  uVar1 = (uint)(uVar16 >> 1);
                  local_54 = ((*(uint *)&pAVar3->field_0x18 >> 3 ^ uVar15) & 1) +
                             p->pVarNums[pAVar3->Id] * 2;
                  local_50 = (uint)(uVar1 != ((*(uint *)&pAVar4->field_0x18 >> 3 & 1) != 0)) +
                             p->pVarNums[pAVar4->Id] * 2;
                  iVar7 = sat_solver_solve(s,&local_58,local_4c,0,0,0,0);
                  if (iVar7 == -1) {
                    pVVar10 = (Vec_Int_t *)malloc(0x10);
                    pVVar10->nCap = 0x10;
                    pVVar10->nSize = 0;
                    piVar11 = (int *)malloc(0x40);
                    pVVar10->pArray = piVar11;
                    Vec_IntPush(pVVar10,((*(uint *)&pAVar3->field_0x18 >> 3 ^ uVar15) & 1) +
                                        pAVar3->Id * 2);
                    Vec_IntPush(pVVar10,(uint)(uVar1 != ((*(uint *)&pAVar4->field_0x18 >> 3 & 1) !=
                                                        0)) + pAVar4->Id * 2);
                    lVar13 = (long)pVVar8->nSize;
                    uVar1 = pVVar8->nCap;
                    if (pVVar8->nSize == uVar1) {
                      if ((int)uVar1 < 0x10) {
                        if (pVVar8->pArray == (void **)0x0) {
                          local_70 = lVar13;
                          ppvVar9 = (void **)malloc(0x80);
                        }
                        else {
                          local_70 = lVar13;
                          ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                        }
                        iVar7 = 0x10;
                      }
                      else {
                        lVar5 = (ulong)uVar1 * 2;
                        if ((int)lVar5 <= (int)uVar1) goto LAB_0065cfad;
                        __size = (ulong)uVar1 << 4;
                        local_78 = lVar5;
                        if (pVVar8->pArray == (void **)0x0) {
                          local_70 = lVar13;
                          ppvVar9 = (void **)malloc(__size);
                        }
                        else {
                          local_70 = lVar13;
                          ppvVar9 = (void **)realloc(pVVar8->pArray,__size);
                        }
                        iVar7 = (int)local_78;
                      }
                      pVVar8->pArray = ppvVar9;
                      pVVar8->nCap = iVar7;
                      lVar13 = local_70;
                    }
LAB_0065cfad:
                    pVVar8->nSize = (int)lVar13 + 1;
                    pVVar8->pArray[lVar13] = pVVar10;
                    if (fVerbose != 0) {
                      printf("Adding prime %d%c %d%c\n",(ulong)(uint)pAVar3->Id,
                             (ulong)(((*(uint *)&pAVar3->field_0x18 >> 3 ^ uVar15) & 1) * 2 + 0x2b),
                             (ulong)(uint)pAVar4->Id);
                    }
                    break;
                  }
                  uVar16 = (ulong)(uVar15 + 1);
                } while (uVar15 + 1 != 3);
              }
            }
          }
          lVar12 = lVar12 + 1;
          __ptr = local_60;
        } while ((int)lVar12 < local_60->nSize);
      }
      lVar14 = lVar14 + 1;
      local_a0 = local_a0 + 1;
    } while (lVar14 < __ptr->nSize);
  }
  printf("Property cone size = %6d    1-lit primes = %5d    2-lit primes = %5d\n",
         (ulong)(uint)__ptr->nSize,(ulong)local_7c,(ulong)(pVVar8->nSize - local_7c));
  sat_solver_delete(s);
  Cnf_DataFree(p);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  piVar11 = local_68;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  if (*(void **)(piVar11 + 2) != (void *)0x0) {
    free(*(void **)(piVar11 + 2));
    piVar11[2] = 0;
    piVar11[3] = 0;
  }
  free(piVar11);
  return pVVar8;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs decomposition of the property output.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Ptr_t * Saig_ManFindPrimes( Aig_Man_t * pAig, int nLits, int fVerbose )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj0, * pObj1, * pRoot, * pMiter;
    Vec_Ptr_t * vPrimes, * vNodes;
    Vec_Int_t * vCube, * vMarks;
    int i0, i1, m, RetValue, Lits[10];
    int fCompl0, fCompl1, nNodes1, nNodes2;
    assert( nLits == 1 || nLits == 2 );
    assert( nLits < 10 );

    // create SAT solver
    pCnf = Cnf_DeriveSimple( pAig, Aig_ManCoNum(pAig) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );

    // collect nodes in the property output cone
    pMiter = Aig_ManCo( pAig, 0 );
    pRoot  = Aig_ObjFanin0( pMiter );
    vNodes = Aig_ManDfsNodes( pAig, &pRoot, 1 );
    // sort nodes by level and remove the last few
 
    // try single nodes
    vPrimes = Vec_PtrAlloc( 100 );
    // create assumptions
    vMarks = Vec_IntStart( Vec_PtrSize(vNodes) );
    Lits[0] = toLitCond( pCnf->pVarNums[Aig_ObjId(pMiter)], 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj0, i0 )
    if ( pObj0 != pRoot )
    {
        // create assumptions
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj0)], pObj0->fPhase );
        // solve the problem
        RetValue = sat_solver_solve( pSat, Lits, Lits+2, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue == l_False )
        {
            vCube = Vec_IntAlloc( 1 );
            Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj0), pObj0->fPhase) );
            Vec_PtrPush( vPrimes, vCube );
            if ( fVerbose )
            printf( "Adding prime %d%c\n", Aig_ObjId(pObj0),  pObj0->fPhase?'-':'+' );
            Vec_IntWriteEntry( vMarks, i0, 1 );
        }
    }
    nNodes1 = Vec_PtrSize(vPrimes);
    if ( nLits > 1 )
    {
        // try adding second literal
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj0, i0 )
        if ( pObj0 != pRoot )
        Vec_PtrForEachEntryStart( Aig_Obj_t *, vNodes, pObj1, i1, i0+1 )
        if ( pObj1 != pRoot )
        {
            if ( Vec_IntEntry(vMarks,i0) || Vec_IntEntry(vMarks,i1) )
                continue;
            for ( m = 0; m < 3; m++ )
            {
                fCompl0 =  m & 1;
                fCompl1 = (m >> 1) & 1;
                // create assumptions
                Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj0)], fCompl0 ^ pObj0->fPhase );
                Lits[2] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj1)], fCompl1 ^ pObj1->fPhase );
                // solve the problem
                RetValue = sat_solver_solve( pSat, Lits, Lits+3, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( RetValue == l_False )
                {
                    vCube = Vec_IntAlloc( 2 );
                    Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj0), fCompl0 ^ pObj0->fPhase) );
                    Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj1), fCompl1 ^ pObj1->fPhase) );
                    Vec_PtrPush( vPrimes, vCube );
                    if ( fVerbose )
                    printf( "Adding prime %d%c %d%c\n", 
                        Aig_ObjId(pObj0), (fCompl0 ^ pObj0->fPhase)?'-':'+', 
                        Aig_ObjId(pObj1), (fCompl1 ^ pObj1->fPhase)?'-':'+' );
                    break;
                }
            }
        }
    }
    nNodes2 = Vec_PtrSize(vPrimes) - nNodes1;

    printf( "Property cone size = %6d    1-lit primes = %5d    2-lit primes = %5d\n", 
        Vec_PtrSize(vNodes), nNodes1, nNodes2 );

    // clean up
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vMarks );
    return vPrimes;
}